

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O3

shared_ptr<duckdb::CSVRejectsTable,_true> __thiscall
duckdb::ObjectCache::
GetOrCreate<duckdb::CSVRejectsTable,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (ObjectCache *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  iterator iVar2;
  ObjectCacheEntry *pOVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **__s2;
  mapped_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar4;
  shared_ptr<duckdb::CSVRejectsTable,_true> sVar5;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  size_type __dnew;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_98;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68 [2];
  CSVRejectsTable *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined8 local_38;
  
  __mutex = (pthread_mutex_t *)((long)&key[1].field_2 + 8);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)key,args);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_58 = (CSVRejectsTable *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::CSVRejectsTable,std::allocator<duckdb::CSVRejectsTable>,std::__cxx11::string_const&,std::__cxx11::string_const&>
              (&local_50,&local_58,(allocator<duckdb::CSVRejectsTable> *)&local_78,args_1,in_R8);
    (this->cache)._M_h._M_buckets = (__buckets_ptr)local_58;
    (this->cache)._M_h._M_bucket_count = (size_type)local_50._M_pi;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (local_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_00bf1f54;
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
LAB_00bf1f54:
    this_00 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)key,args);
    shared_ptr<duckdb::ObjectCacheEntry,_true>::operator=<duckdb::CSVRejectsTable,_0>
              (this_00,(shared_ptr<duckdb::CSVRejectsTable,_true> *)this);
    goto LAB_00bf1ff7;
  }
  local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
                 ._M_cur + 0x28);
  local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
               ._M_cur + 0x30);
  if (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  if (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
LAB_00bf1f96:
    (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->cache)._M_h._M_bucket_count = 0;
  }
  else {
    pOVar3 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->(&local_98);
    (*pOVar3->_vptr_ObjectCacheEntry[2])(&local_58,pOVar3);
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x17;
    local_78 = local_68;
    __s2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ::std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&stack0xffffffffffffffc8);
    local_68[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
    *__s2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x656a65725f767363;
    __s2[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6c6261745f737463;
    builtin_strncpy((char *)((long)__s2 + 0xf),"le_cache",8);
    local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
    *(char *)((long)__s2 + local_38) = '\0';
    local_78 = __s2;
    if (local_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38) {
      if (local_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar4 = false;
      }
      else {
        iVar1 = bcmp(local_58,__s2,(size_t)local_50._M_pi);
        bVar4 = iVar1 != 0;
      }
    }
    else {
      bVar4 = true;
    }
    if (__s2 != local_68) {
      operator_delete(__s2);
    }
    if (local_58 != (CSVRejectsTable *)&stack0xffffffffffffffb8) {
      operator_delete(local_58);
    }
    if (bVar4) goto LAB_00bf1f96;
    local_88.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_98.internal.
             super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.internal.
              super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.internal.
              super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::CSVRejectsTable>((duckdb *)this,&local_88);
    if (local_88.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.internal.
                 super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_98.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.
               super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_00bf1ff7:
  pthread_mutex_unlock(__mutex);
  sVar5.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::CSVRejectsTable,_true>)
         sVar5.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> GetOrCreate(const string &key, ARGS &&... args) {
		lock_guard<mutex> glock(lock);

		auto entry = cache.find(key);
		if (entry == cache.end()) {
			auto value = make_shared_ptr<T>(args...);
			cache[key] = value;
			return value;
		}
		auto object = entry->second;
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}